

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O2

Pubkey * __thiscall
cfd::core::Pubkey::operator+=(Pubkey *__return_storage_ptr__,Pubkey *this,Pubkey *right)

{
  Pubkey key;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  CombinePubkey((Pubkey *)&local_30,this,right);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)__return_storage_ptr__,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)this);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

Pubkey Pubkey::operator+=(const Pubkey &right) {
  Pubkey key = Pubkey::CombinePubkey(*this, right);
  *this = key;
  return *this;
}